

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O1

QPlatformServiceColorPicker * __thiscall
QDesktopUnixServices::colorPicker(QDesktopUnixServices *this,QWindow *parent)

{
  char cVar1;
  char cVar2;
  QObject *this_00;
  long in_FS_OFFSET;
  QLatin1String QVar3;
  QArrayData *local_60;
  undefined8 local_58;
  undefined8 local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY");
  cVar2 = '\x01';
  if (cVar1 != '\0') {
    QGuiApplication::platformName();
    QVar3.m_data = (char *)0x7;
    QVar3.m_size = (qsizetype)local_48;
    cVar2 = QString::startsWith(QVar3,0x6912fe);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
  }
  if (cVar2 == '\0') {
    this_00 = (QObject *)0x0;
  }
  else {
    this_00 = (QObject *)operator_new(0x28);
    (*(this->super_QPlatformServices)._vptr_QPlatformServices[7])(&local_60,this,parent);
    QObject::QObject(this_00,&parent->super_QObject);
    *(undefined ***)this_00 = &PTR_metaObject_007f3dd0;
    *(QArrayData **)(this_00 + 0x10) = local_60;
    *(undefined8 *)(this_00 + 0x18) = local_58;
    *(undefined8 *)(this_00 + 0x20) = local_50;
    if (local_60 != (QArrayData *)0x0) {
      LOCK();
      (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QPlatformServiceColorPicker *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformServiceColorPicker *QDesktopUnixServices::colorPicker(QWindow *parent)
{
#if QT_CONFIG(dbus)
    // Make double sure that we are in a wayland environment. In particular check
    // WAYLAND_DISPLAY so also XWayland apps benefit from portal-based color picking.
    // Outside wayland we'll rather rely on other means than the XDG desktop portal.
    if (!qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY")
        || QGuiApplication::platformName().startsWith("wayland"_L1)) {
        return new XdgDesktopPortalColorPicker(portalWindowIdentifier(parent), parent);
    }
    return nullptr;
#else
    Q_UNUSED(parent);
    return nullptr;
#endif
}